

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<unsigned_long>(SpirVAssembly *this,deInt64 number)

{
  Buffer<unsigned_long> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<unsigned_long> local_39;
  value_type_conflict5 local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  value_type_conflict5 local_18;
  deInt64 number_local;
  
  local_18 = number;
  number_local = (deInt64)this;
  this_00 = (Buffer<unsigned_long> *)operator_new(0x20);
  local_38 = local_18;
  std::allocator<unsigned_long>::allocator(&local_39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,1,&local_38,&local_39);
  Buffer<unsigned_long>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_30);
  std::allocator<unsigned_long>::~allocator(&local_39);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}